

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> * chrono::Qadd(ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ChQuaternion<double> *result;
  ChQuaternion<double> *in_RDI;
  
  dVar1 = qa->m_data[1];
  dVar2 = qa->m_data[2];
  dVar3 = qa->m_data[3];
  dVar4 = qb->m_data[1];
  dVar5 = qb->m_data[2];
  dVar6 = qb->m_data[3];
  in_RDI->m_data[0] = qa->m_data[0] + qb->m_data[0];
  in_RDI->m_data[1] = dVar1 + dVar4;
  in_RDI->m_data[2] = dVar2 + dVar5;
  in_RDI->m_data[3] = dVar3 + dVar6;
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qadd(const ChQuaternion<double>& qa, const ChQuaternion<double>& qb) {
    ChQuaternion<double> result;
    result.e0() = qa.e0() + qb.e0();
    result.e1() = qa.e1() + qb.e1();
    result.e2() = qa.e2() + qb.e2();
    result.e3() = qa.e3() + qb.e3();
    return result;
}